

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuConfig.cpp
# Opt level: O3

vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> * __thiscall
xmrig::CpuConfig::get
          (vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>
           *__return_storage_ptr__,CpuConfig *this,Miner *miner)

{
  pointer pCVar1;
  mapped_type *pmVar2;
  CpuThread *thread;
  pointer pCVar3;
  Miner *local_40;
  String local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = miner;
  String::String(&local_38,"cn/blur");
  pmVar2 = std::
           map<xmrig::String,_xmrig::CpuThreads,_std::less<xmrig::String>,_std::allocator<std::pair<const_xmrig::String,_xmrig::CpuThreads>_>_>
           ::at(&(this->m_threads).m_profiles,&local_38);
  if (local_38.m_data != (char *)0x0) {
    operator_delete__(local_38.m_data);
  }
  pCVar3 = (pmVar2->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (pmVar2->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar3 != pCVar1) {
    std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::reserve
              (__return_storage_ptr__,(long)pCVar1 - (long)pCVar3 >> 4);
    pCVar3 = (pmVar2->m_data).
             super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar1 = (pmVar2->m_data).
             super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar3 != pCVar1) {
      do {
        std::vector<xmrig::CpuLaunchData,std::allocator<xmrig::CpuLaunchData>>::
        emplace_back<xmrig::Miner_const*&,xmrig::CpuConfig_const&,xmrig::CpuThread_const&>
                  ((vector<xmrig::CpuLaunchData,std::allocator<xmrig::CpuLaunchData>> *)
                   __return_storage_ptr__,&local_40,this,pCVar3);
        pCVar3 = pCVar3 + 1;
      } while (pCVar3 != pCVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<xmrig::CpuLaunchData> xmrig::CpuConfig::get(const Miner *miner) const
{
    std::vector<CpuLaunchData> out;
    const CpuThreads &threads = m_threads.get();

    if (threads.isEmpty()) {
        return out;
    }

    out.reserve(threads.count());

    for (const CpuThread &thread : threads.data()) {
        out.emplace_back(miner, *this, thread);
    }

    return out;
}